

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O1

int write_lattice(ps_decoder_t *ps,char *latdir,char *uttid)

{
  int iVar1;
  int extraout_EAX;
  ps_lattice_t *dag;
  ps_config_t *config;
  char *pcVar2;
  logmath_t *lmath;
  long ln;
  double p;
  
  dag = ps_get_lattice(ps);
  if (dag == (ps_lattice_t *)0x0) {
    pcVar2 = "Failed to obtain word lattice for utterance %s\n";
    ln = 0x1f9;
  }
  else {
    config = ps_get_config(ps);
    pcVar2 = ps_config_str(config,"outlatext");
    uttid = string_join(latdir,"/",uttid,pcVar2,0);
    lmath = ps_get_logmath(ps);
    p = ps_config_float(config,"outlatbeam");
    iVar1 = logmath_log(lmath,(float64)p);
    ps_lattice_posterior_prune(dag,iVar1);
    pcVar2 = ps_config_str(config,"outlatfmt");
    iVar1 = strcmp("htk",pcVar2);
    if (iVar1 == 0) {
      iVar1 = ps_lattice_write_htk(dag,uttid);
      if (-1 < iVar1) {
        return iVar1;
      }
      pcVar2 = "Failed to write lattice to %s\n";
      ln = 0x205;
    }
    else {
      iVar1 = ps_lattice_write(dag,uttid);
      if (-1 < iVar1) {
        return iVar1;
      }
      pcVar2 = "Failed to write lattice to %s\n";
      ln = 0x20b;
    }
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
          ,ln,pcVar2,uttid);
  return extraout_EAX;
}

Assistant:

static int
write_lattice(ps_decoder_t *ps, char const *latdir, char const *uttid)
{
    ps_lattice_t *lat;
    logmath_t *lmath;
    cmd_ln_t *config;
    char *outfile;
    int32 beam;

    if ((lat = ps_get_lattice(ps)) == NULL) {
        E_ERROR("Failed to obtain word lattice for utterance %s\n", uttid);
        return -1;
    }
    config = ps_get_config(ps);
    outfile = string_join(latdir, "/", uttid,
                          ps_config_str(config, "outlatext"), NULL);
    /* Prune lattice. */
    lmath = ps_get_logmath(ps);
    beam = logmath_log(lmath, ps_config_float(config, "outlatbeam"));
    ps_lattice_posterior_prune(lat, beam);
    if (0 == strcmp("htk", ps_config_str(config, "outlatfmt"))) {
        if (ps_lattice_write_htk(lat, outfile) < 0) {
            E_ERROR("Failed to write lattice to %s\n", outfile);
            return -1;
        }
    }
    else {
        if (ps_lattice_write(lat, outfile) < 0) {
            E_ERROR("Failed to write lattice to %s\n", outfile);
            return -1;
        }
    }
    return 0;
}